

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O2

void Omega_h::transfer_common<long>
               (Mesh *old_mesh,Mesh *new_mesh,Int ent_dim,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,LOs *prods2new_ents,TagBase *tagbase,
               Read<signed_char> *prod_data)

{
  LO LVar1;
  Int width;
  Write<signed_char> new_data;
  allocator local_d1;
  Write<long> local_d0;
  Mesh *local_c0;
  Write<int> *local_b8;
  Write<int> local_b0;
  Write<int> local_a0;
  Write<int> local_90;
  Write<int> local_80;
  Write<int> local_70;
  Write<int> local_60;
  string local_50;
  
  local_c0 = old_mesh;
  local_b8 = &same_ents2new_ents->write_;
  LVar1 = Mesh::nents(new_mesh,ent_dim);
  width = TagBase::ncomps(tagbase);
  std::__cxx11::string::string((string *)&local_50,"",&local_d1);
  Write<long>::Write(&local_d0,LVar1 * width,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Write<long>::Write(&local_70,(Write<int> *)prod_data);
  Write<int>::Write(&local_80,&prods2new_ents->write_);
  Write<long>::Write(&local_90,(Write<int> *)&local_d0);
  map_into<long>((Read<signed_char> *)&local_70,(LOs *)&local_80,(Write<signed_char> *)&local_90,
                 width);
  Write<long>::~Write((Write<long> *)&local_90);
  Write<int>::~Write(&local_80);
  Write<long>::~Write((Write<long> *)&local_70);
  Write<int>::Write(&local_a0,&same_ents2old_ents->write_);
  Write<int>::Write(&local_b0,local_b8);
  Write<long>::Write(&local_60,(Write<int> *)&local_d0);
  transfer_common2<long>
            (local_c0,new_mesh,ent_dim,(LOs *)&local_a0,(LOs *)&local_b0,tagbase,
             (Write<signed_char> *)&local_60);
  Write<long>::~Write((Write<long> *)&local_60);
  Write<int>::~Write(&local_b0);
  Write<int>::~Write(&local_a0);
  Write<long>::~Write(&local_d0);
  return;
}

Assistant:

void transfer_common(Mesh* old_mesh, Mesh* new_mesh, Int ent_dim,
    LOs same_ents2old_ents, LOs same_ents2new_ents, LOs prods2new_ents,
    TagBase const* tagbase, Read<T> prod_data) {
  auto nnew_ents = new_mesh->nents(ent_dim);
  auto ncomps = tagbase->ncomps();
  auto new_data = Write<T>(nnew_ents * ncomps);
  map_into(prod_data, prods2new_ents, new_data, ncomps);
  transfer_common2(old_mesh, new_mesh, ent_dim, same_ents2old_ents,
      same_ents2new_ents, tagbase, new_data);
}